

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          list<long,_std::allocator<long>_> *singular)

{
  complex<long_double> *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  int64_t iVar3;
  complex<long_double> **ppcVar4;
  ostream *poVar5;
  void *this_00;
  int64_t iVar6;
  long lVar7;
  TPZBaseMatrix *in_RDI;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar9;
  uint l;
  uint tmp;
  uint max_l;
  complex<long_double> *end_i;
  complex<long_double> *elem_i;
  int64_t j;
  int64_t i;
  complex<long_double> *end_k;
  complex<long_double> *elem_k;
  complex<long_double> sum;
  int64_t k;
  int64_t dimension;
  type_conflict2 Tol;
  complex<long_double> pivot;
  complex<long_double> *pcVar10;
  undefined2 in_stack_fffffffffffffd70;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffd72;
  complex<long_double> *__x;
  undefined2 uVar12;
  undefined6 in_stack_fffffffffffffd82;
  undefined6 uVar13;
  complex<long_double> *in_stack_fffffffffffffda0;
  complex<long_double> *in_stack_fffffffffffffdd8;
  complex<long_double> *in_stack_fffffffffffffde0;
  double local_1f8 [2];
  value_type_conflict5 *local_1e8;
  undefined8 uStack_1e0;
  double local_1d8 [8];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  uint local_134;
  uint local_130;
  uint local_12c;
  complex<long_double> *local_128;
  complex<long_double> *local_120;
  long local_118;
  long local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  complex<long_double> *local_80;
  complex<long_double> local_78;
  long local_58;
  long local_50;
  longdouble local_48;
  complex<long_double> local_38;
  
  if (in_RDI->fDecomposed != '\x03') {
    if (in_RDI->fDecomposed != '\0') {
      TPZMatrix<std::complex<long_double>_>::Error
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    std::__cxx11::list<long,_std::allocator<long>_>::clear
              ((list<long,_std::allocator<long>_> *)
               CONCAT62(in_stack_fffffffffffffd72,in_stack_fffffffffffffd70));
    lVar8 = (longdouble)0;
    __x = SUB108(lVar8,0);
    uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
    uVar12 = uVar11;
    std::complex<long_double>::complex(&local_38,lVar8,lVar8);
    ZeroTolerance<long_double,_nullptr>((longdouble *)CONCAT62(in_stack_fffffffffffffd72,uVar11));
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_50 = CONCAT44(extraout_var,iVar2);
    for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
      iVar3 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                   CONCAT62(in_stack_fffffffffffffd82,uVar12),(int64_t)__x);
      if (iVar3 == 0) {
        return 0;
      }
      lVar8 = (longdouble)0;
      pcVar10 = SUB108(lVar8,0);
      uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
      lVar9 = in_ST5;
      __x = pcVar10;
      uVar12 = uVar11;
      std::complex<long_double>::complex(&local_78,lVar8,lVar8);
      ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_58);
      local_80 = *ppcVar4;
      ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_58);
      pcVar1 = *ppcVar4;
      iVar3 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                   CONCAT62(in_stack_fffffffffffffd82,uVar12),(int64_t)__x);
      lVar8 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar9;
      while (local_80 = local_80 + 1, local_80 < pcVar1 + iVar3) {
        std::conj<long_double>(in_stack_fffffffffffffda0);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),pcVar10);
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),pcVar10);
      }
      TPZVec<std::complex<long_double>_*>::operator[]
                ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_58);
      std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),pcVar10);
      local_38._M_value._16_8_ = local_d8;
      local_38._M_value._24_8_ = uStack_d0;
      local_38._M_value._0_8_ = local_e8;
      local_38._M_value._8_8_ = uStack_e0;
      std::abs<long_double>((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd82,uVar12));
      if (lVar8 < local_48) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)CONCAT62(in_stack_fffffffffffffd82,uVar12),
                   (value_type_conflict5 *)__x);
        poVar5 = std::operator<<((ostream *)&std::cout,"Decompose_Cholesky");
        poVar5 = std::operator<<(poVar5," Singular equation pivot ");
        poVar5 = std::operator<<(poVar5,(complex *)&local_38);
        poVar5 = std::operator<<(poVar5," k ");
        this_00 = (void *)std::ostream::operator<<(poVar5,local_58);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::complex<long_double>::operator=(&local_38,(longdouble)1);
      }
      std::sqrt<long_double>((complex<long_double> *)in_RDI);
      ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_58);
      pcVar10 = *ppcVar4;
      *(undefined8 *)pcVar10->_M_value = local_108;
      *(undefined8 *)(pcVar10->_M_value + 8) = local_100;
      *(undefined8 *)(pcVar10->_M_value + 0x10) = local_f8;
      *(undefined8 *)(pcVar10->_M_value + 0x18) = local_f0;
      local_38._M_value._0_8_ = *(undefined8 *)pcVar10->_M_value;
      local_38._M_value._8_8_ = *(undefined8 *)(pcVar10->_M_value + 8);
      local_38._M_value._16_8_ = *(undefined8 *)(pcVar10->_M_value + 0x10);
      local_38._M_value._24_8_ = *(undefined8 *)(pcVar10->_M_value + 0x18);
      local_118 = 2;
      local_110 = local_58;
      while (local_110 = local_110 + 1, local_110 < local_50) {
        iVar6 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                     CONCAT62(in_stack_fffffffffffffd82,uVar12),(int64_t)__x);
        if (local_118 < iVar6) {
          lVar8 = (longdouble)0;
          pcVar10 = SUB108(lVar8,0);
          uVar11 = (undefined2)((unkuint10)lVar8 >> 0x40);
          std::complex<long_double>::operator=(&local_78,lVar8);
          ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                              ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_110);
          local_120 = *ppcVar4 + local_118;
          ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                              ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_110 + 1);
          local_128 = *ppcVar4;
          ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                              ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_58);
          local_12c = (uint)((long)local_128 - (long)local_120 >> 5);
          local_130 = (uint)((long)(pcVar1 + iVar3) - (long)(*ppcVar4 + 1) >> 5);
          if (local_130 < local_12c) {
            local_12c = local_130;
          }
          for (local_134 = 0; local_134 < local_12c; local_134 = local_134 + 1) {
            local_120 = local_120 + 1;
            std::conj<long_double>(in_stack_fffffffffffffda0);
            std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),
                           pcVar10);
            std::complex<long_double>::operator+=
                      ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),pcVar10);
          }
          TPZVec<std::complex<long_double>_*>::operator[]
                    ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_110);
          std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),pcVar10)
          ;
          std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffd72,uVar11),pcVar10)
          ;
          ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                              ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_110);
          pcVar10 = *ppcVar4 + local_118 + -1;
          *(undefined8 *)pcVar10->_M_value = local_198;
          *(undefined8 *)(pcVar10->_M_value + 8) = local_190;
          *(undefined8 *)(pcVar10->_M_value + 0x10) = local_188;
          *(undefined8 *)(pcVar10->_M_value + 0x18) = local_180;
        }
        else {
          iVar6 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                       CONCAT62(in_stack_fffffffffffffd82,uVar12),(int64_t)__x);
          if (iVar6 == local_118) {
            TPZVec<std::complex<long_double>_*>::operator[]
                      ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 1),local_110);
            std::complex<long_double>::operator/=
                      (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          }
        }
        local_118 = local_118 + 1;
      }
    }
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar3 != 0) {
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      lVar7 = iVar3 + -1;
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1d8,in_RDI,lVar7,iVar3 + -1);
      fabs(local_1d8[0]);
      std::complex<long_double>::complex
                ((complex<long_double> *)local_1f8,(longdouble)1e-15,(longdouble)0);
      uVar12 = (undefined2)uStack_1e0;
      uVar13 = SUB86(uStack_1e0,2);
      fabs(local_1f8[0]);
      if (in_ST0 < in_ST1) {
        TPZBaseMatrix::Rows(in_RDI);
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)CONCAT62(uVar13,uVar12),local_1e8);
        iVar3 = TPZBaseMatrix::Rows(in_RDI);
        iVar6 = TPZBaseMatrix::Rows(in_RDI);
        std::complex<long_double>::complex
                  ((complex<long_double> *)&stack0xfffffffffffffdd8,(longdouble)1,(longdouble)0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,iVar3 + -1,iVar6 + -1,&stack0xfffffffffffffdd8);
      }
    }
    in_RDI->fDecomposed = '\x03';
    in_RDI->fDefPositive = '\x01';
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}